

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponentiation.cc
# Opt level: O1

int BN_mod_exp(BIGNUM *r,BIGNUM *a,BIGNUM *p,BIGNUM *m,BN_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  BIGNUM *a_00;
  BIGNUM *pBVar4;
  uint uVar5;
  
  if (m->neg != 0) {
    ERR_put_error(3,0,0x6d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/exponentiation.cc"
                  ,0x6a);
    return 0;
  }
  if (((a->neg != 0) || (iVar2 = BN_ucmp(a,m), -1 < iVar2)) &&
     (iVar2 = BN_nnmod(r,a,m,ctx), a = r, iVar2 == 0)) {
    return 0;
  }
  iVar2 = BN_is_odd((BIGNUM *)m);
  if (iVar2 != 0) {
    iVar2 = BN_mod_exp_mont(r,a,p,m,ctx,(BN_MONT_CTX *)0x0);
    return iVar2;
  }
  iVar2 = BN_num_bits(p);
  if (iVar2 == 0) {
    iVar2 = BN_one((BIGNUM *)r);
    return iVar2;
  }
  BN_CTX_start(ctx);
  a_00 = BN_CTX_get(ctx);
  uVar5 = 0;
  if ((a_00 != (BIGNUM *)0x0) && (pBVar4 = BN_copy(a_00,a), pBVar4 != (BIGNUM *)0x0)) {
    iVar3 = BN_is_bit_set(p,iVar2 + -1);
    if (iVar3 == 0) {
      __assert_fail("BN_is_bit_set(p, bits - 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/exponentiation.cc"
                    ,0x58,
                    "int mod_exp_even(BIGNUM *, const BIGNUM *, const BIGNUM *, const BIGNUM *, BN_CTX *)"
                   );
    }
    pBVar4 = BN_copy(r,a_00);
    if (pBVar4 != (BIGNUM *)0x0) {
      uVar5 = iVar2 - 2;
      if (1 < iVar2) {
        do {
          iVar2 = BN_mod_sqr(r,r,m,ctx);
          if ((iVar2 == 0) ||
             ((iVar2 = BN_is_bit_set(p,uVar5), iVar2 != 0 &&
              (iVar2 = BN_mod_mul(r,r,a_00,m,ctx), iVar2 == 0)))) goto LAB_0046be6b;
          bVar1 = 0 < (int)uVar5;
          uVar5 = uVar5 - 1;
        } while (bVar1);
        uVar5 = 0xffffffff;
      }
LAB_0046be6b:
      uVar5 = uVar5 >> 0x1f;
    }
  }
  BN_CTX_end(ctx);
  return uVar5;
}

Assistant:

int BN_mod_exp(BIGNUM *r, const BIGNUM *a, const BIGNUM *p, const BIGNUM *m,
               BN_CTX *ctx) {
  if (m->neg) {
    OPENSSL_PUT_ERROR(BN, BN_R_NEGATIVE_NUMBER);
    return 0;
  }
  if (a->neg || BN_ucmp(a, m) >= 0) {
    if (!BN_nnmod(r, a, m, ctx)) {
      return 0;
    }
    a = r;
  }

  if (BN_is_odd(m)) {
    return BN_mod_exp_mont(r, a, p, m, ctx, NULL);
  }

  return mod_exp_even(r, a, p, m, ctx);
}